

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<4096>,Blob<128>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<4096> *k,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  Blob<128> h;
  Blob<128> local_40;
  
  Blob<128>::Blob(&local_40);
  while (start < 0x1000) {
    flipbit(k,0x200,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0x200,0,&local_40);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_40);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<4096>,Blob<128>>(hash,start + 1U,bitsleft + -1,inclusive,k,hashes);
    }
    flipbit(k,0x200,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}